

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O1

char * uo_json_find_value(char *json,char *name)

{
  ushort *puVar1;
  int iVar2;
  size_t __n;
  ushort **ppuVar3;
  char *pcVar4;
  char *json_str;
  char *__s;
  char *unaff_R13;
  bool bVar5;
  
  __n = strlen(name);
  ppuVar3 = __ctype_b_loc();
  puVar1 = *ppuVar3;
  __s = json + -1;
  do {
    pcVar4 = __s + 1;
    __s = __s + 1;
  } while ((*(byte *)((long)puVar1 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
  if (*pcVar4 == '{') {
    do {
      if (*__s == '\0') goto LAB_001019b2;
      pcVar4 = strchr(__s,0x7d);
      if (((pcVar4 == (char *)0x0) ||
          (json_str = strchr(__s,0x22), pcVar4 < json_str || json_str == (char *)0x0)) ||
         (pcVar4 = uo_json_find_str_end(json_str), pcVar4 == (char *)0x0)) {
LAB_0010199e:
        bVar5 = false;
        unaff_R13 = (char *)0x0;
      }
      else {
        if (__n + 2 == (long)pcVar4 - (long)json_str) {
          iVar2 = bcmp(name,json_str + 1,__n);
          bVar5 = iVar2 == 0;
        }
        else {
          bVar5 = false;
        }
        __s = strchr(pcVar4,0x3a);
        if (__s == (char *)0x0) {
LAB_001019ab:
          __s = (char *)0x0;
          goto LAB_0010199e;
        }
        do {
          pcVar4 = __s + 1;
          __s = __s + 1;
        } while ((*(byte *)((long)puVar1 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
        if (bVar5) {
          bVar5 = false;
          unaff_R13 = __s;
        }
        else {
          __s = uo_json_find_end(__s);
          if (__s == (char *)0x0) goto LAB_001019ab;
          pcVar4 = strchr(__s + 1,0x7d);
          if (pcVar4 == (char *)0x0) goto LAB_0010199e;
          __s = strchr(__s,0x2c);
          bVar5 = __s != (char *)0x0;
          if (!bVar5) {
            unaff_R13 = (char *)0x0;
          }
        }
      }
    } while (bVar5);
  }
  else {
LAB_001019b2:
    unaff_R13 = (char *)0x0;
  }
  return unaff_R13;
}

Assistant:

char *uo_json_find_value(
    const char *json,
    const char *name)
{
    size_t name_len = strlen(name);

    const char *p = json;

    while (isspace(*p))
        ++p;

    if (*p != '{')
        return NULL;

    while (*p)
    {
        const char *right_brace = strchr(p, '}');
        if (!right_brace)
            return NULL;

        const char *key = strchr(p, '\"');
        if (!key || right_brace < key)
            return NULL;

        const char *key_end = uo_json_find_str_end(key);
        if (!key_end)
            return NULL;

        bool is_match = name_len + 2 == key_end - key
            && memcmp(name, key + 1, name_len) == 0;

        p = strchr(key_end, ':');
        if (!p)
            return NULL;

        ++p;

        while (isspace(*p))
            ++p;

        if (is_match)
            return (char *)p;

        p = uo_json_find_end(p);
        if (!p)
            return NULL;

        right_brace = strchr(p + 1, '}');
        if (!right_brace)
            return NULL;

        p = strchr(p, ',');
        if (!p)
            return NULL;
    }

    return NULL;
}